

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

string * __thiscall
raspicam::_private::Private_Impl_Still::getId_abi_cxx11_(Private_Impl_Still *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  string *in_RDI;
  char aux [100];
  string str;
  char line [1024];
  bool found;
  ifstream file;
  char serial [1024];
  ostream *in_stack_fffffffffffff4d0;
  allocator<char> *in_stack_fffffffffffff4d8;
  undefined6 in_stack_fffffffffffff4e0;
  undefined1 in_stack_fffffffffffff4e6;
  byte bVar5;
  undefined1 in_stack_fffffffffffff4e7;
  allocator<char> local_ac9;
  undefined1 local_ac8 [111];
  allocator<char> local_a59;
  string local_a58 [32];
  undefined1 local_a38 [1027];
  byte local_635;
  undefined4 local_634;
  allocator<char> local_62d [13];
  long local_620 [65];
  undefined1 local_418 [1048];
  
  local_418[0] = 0;
  std::ifstream::ifstream(local_620,"/proc/cpuinfo",8);
  bVar1 = std::ios::operator!((ios *)((long)local_620 + *(long *)(local_620[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_635 = 0;
    while( true ) {
      bVar1 = std::ios::eof();
      bVar5 = 0;
      if ((bVar1 & 1) == 0) {
        bVar5 = local_635 ^ 0xff;
      }
      if ((bVar5 & 1) == 0) break;
      std::istream::getline((char *)local_620,(long)local_a38);
      in_stack_fffffffffffff4d8 = &local_a59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,CONCAT16(bVar5,in_stack_fffffffffffff4e0)),
                 (char *)in_stack_fffffffffffff4d8,(allocator<char> *)in_stack_fffffffffffff4d0);
      std::allocator<char>::~allocator(&local_a59);
      lVar3 = std::__cxx11::string::find((char *)local_a58,0x111671);
      if (lVar3 != -1) {
        iVar2 = __isoc99_sscanf(local_a38,"%s : %s",local_ac8,local_418);
        if (iVar2 == 2) {
          local_635 = 1;
        }
        else {
          in_stack_fffffffffffff4d0 =
               std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private_still/private_still_impl.cpp"
                              );
          poVar4 = std::operator<<(in_stack_fffffffffffff4d0," ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x368);
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = std::operator<<(poVar4,"getId");
          poVar4 = std::operator<<(poVar4,"Error parsing /proc/cpuinfo");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      std::__cxx11::string::~string(local_a58);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,CONCAT16(bVar5,in_stack_fffffffffffff4e0)),
               (char *)in_stack_fffffffffffff4d8,(allocator<char> *)in_stack_fffffffffffff4d0);
    std::allocator<char>::~allocator(&local_ac9);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private_still/private_still_impl.cpp"
                            );
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x35b);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = std::operator<<(poVar4,"getId");
    poVar4 = std::operator<<(poVar4,"Could not read /proc/cpuinfo");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff4e7,
                        CONCAT16(in_stack_fffffffffffff4e6,in_stack_fffffffffffff4e0)),
               (char *)in_stack_fffffffffffff4d8,(allocator<char> *)in_stack_fffffffffffff4d0);
    std::allocator<char>::~allocator(local_62d);
  }
  local_634 = 1;
  std::ifstream::~ifstream(local_620);
  return in_RDI;
}

Assistant:

string Private_Impl_Still::getId() const{
            char serial[1024];
            serial[0]='\0';
            ifstream file ( "/proc/cpuinfo" );
            if ( !file ) {
                cerr<<__FILE__<<" "<<__LINE__<<":"<<__func__<<"Could not read /proc/cpuinfo"<<endl;
                return serial;
            }
            //read lines until find serial
            bool found=false;
            while ( !file.eof() && !found ) {
                char line[1024];
                file.getline ( line,1024 );
                string str ( line );
                char aux[100];

                if ( str.find ( "Serial" ) !=string::npos ) {
                    if ( sscanf ( line,"%s : %s",aux,serial ) !=2 ) {
                        cerr<<__FILE__<<" "<<__LINE__<<":"<<__func__<<"Error parsing /proc/cpuinfo"<<endl;
                    } else found=true;
                }
            };
            return serial;
        }